

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O0

void __thiscall PrintLanguage::opBinary(PrintLanguage *this,OpToken *tok,PcodeOp *op)

{
  bool bVar1;
  LowlevelError *this_00;
  Varnode *pVVar2;
  allocator local_41;
  string local_40 [32];
  PcodeOp *local_20;
  PcodeOp *op_local;
  OpToken *tok_local;
  PrintLanguage *this_local;
  
  local_20 = op;
  op_local = (PcodeOp *)tok;
  tok_local = (OpToken *)this;
  bVar1 = isSet(this,0x2000);
  if (bVar1) {
    op_local = *(PcodeOp **)&(op_local->start).uniq;
    unsetMod(this,0x2000);
    if (op_local == (PcodeOp *)0x0) {
      this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Could not find fliptoken",&local_41);
      LowlevelError::LowlevelError(this_00,(string *)local_40);
      __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  pushOp(this,(OpToken *)op_local,local_20);
  pVVar2 = PcodeOp::getIn(local_20,1);
  pushVnImplied(this,pVVar2,local_20,this->mods);
  pVVar2 = PcodeOp::getIn(local_20,0);
  pushVnImplied(this,pVVar2,local_20,this->mods);
  return;
}

Assistant:

void PrintLanguage::opBinary(const OpToken *tok,const PcodeOp *op)

{
  if (isSet(negatetoken)) {
    tok = tok->negate;
    unsetMod(negatetoken);
    if (tok == (const OpToken *)0)
      throw LowlevelError("Could not find fliptoken");
  }
  pushOp(tok,op);		// Push on reverse polish notation
  // implied vn's pushed on in reverse order for efficiency
  // see PrintLanguage::pushVnImplied
  pushVnImplied(op->getIn(1),op,mods);
  pushVnImplied(op->getIn(0),op,mods);
}